

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

Split * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::findFallback(Split *__return_storage_ptr__,
              BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
              *this,SetMB *set)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  PrimRefMB *pPVar4;
  uint uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar8 = (set->super_PrimInfoMB).object_range._begin;
  uVar3 = (set->super_PrimInfoMB).object_range._end;
  if (uVar3 == uVar8) {
LAB_00d4f59c:
    uVar5 = 1;
    if (((this->cfg).singleLeafTimeSegment == true) && (bVar9 = uVar8 < uVar3, bVar9)) {
      fVar1 = (set->super_PrimInfoMB).time_range.lower;
      fVar2 = (set->super_PrimInfoMB).time_range.upper;
      pfVar6 = &set->prims->items[uVar8].time_range.upper;
      do {
        uVar8 = uVar8 + 1;
        fVar14 = (float)(uint)pfVar6[-2];
        fVar11 = (*(BBox1f *)(pfVar6 + -1)).lower;
        fVar13 = (*(BBox1f *)(pfVar6 + -1)).upper - fVar11;
        fVar10 = floorf(((fVar1 - fVar11) / fVar13) * 1.0000002 * fVar14);
        fVar12 = 0.0;
        if (0.0 <= fVar10) {
          fVar12 = fVar10;
        }
        fVar10 = ceilf(((fVar2 - fVar11) / fVar13) * 0.99999976 * fVar14);
        if (fVar14 <= fVar10) {
          fVar10 = fVar14;
        }
        if (1 < (int)fVar10 - (int)fVar12) {
          fVar1 = ((BBox1f *)(pfVar6 + -1))->lower;
          fVar2 = *pfVar6;
          __return_storage_ptr__->sah = 0.0;
          __return_storage_ptr__->dim = 0;
          (__return_storage_ptr__->field_2).fpos =
               ((float)(((int)fVar10 + (int)fVar12) / 2) * (fVar2 - fVar1)) / fVar14 + fVar1;
          __return_storage_ptr__->data = 2;
          uVar5 = 1;
          if (bVar9) {
            return __return_storage_ptr__;
          }
          goto LAB_00d4f6f8;
        }
        bVar9 = uVar8 < uVar3;
        pfVar6 = pfVar6 + 0x14;
      } while (uVar8 != uVar3);
      uVar5 = 1;
    }
  }
  else {
    pPVar4 = set->prims->items;
    pfVar6 = pPVar4[uVar8 + 1].lbounds.bounds0.lower.field_0.m128 + 3;
    uVar7 = uVar8;
    do {
      uVar7 = uVar7 + 1;
      if (uVar3 <= uVar7) goto LAB_00d4f59c;
      fVar1 = *pfVar6;
      pfVar6 = pfVar6 + 0x14;
    } while (fVar1 == pPVar4[uVar8].lbounds.bounds0.lower.field_0.m128[3]);
    uVar5 = 3;
  }
LAB_00d4f6f8:
  __return_storage_ptr__->sah = 0.0;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = 0;
  __return_storage_ptr__->data = uVar5;
  return __return_storage_ptr__;
}

Assistant:

__noinline Split findFallback(const SetMB& set)
          {
            /* split if primitives are not from same geometry */
            if (!sameGeometry(set))
              return Split(0.0f,Split::SPLIT_GEOMID);
            
            /* if a leaf can only hold a single time-segment, we might have to do additional temporal splits */
            if (cfg.singleLeafTimeSegment)
            {
              /* test if one primitive has more than one time segment in time range, if so split time */
              for (size_t i=set.begin(); i<set.end(); i++)
              {
                const PrimRefMB& prim = (*set.prims)[i];
                const range<int> itime_range = prim.timeSegmentRange(set.time_range);
                const int localTimeSegments = itime_range.size();
                assert(localTimeSegments > 0);
                if (localTimeSegments > 1) {
                  const int icenter = (itime_range.begin() + itime_range.end())/2;
                  const float splitTime = prim.timeStep(icenter);
                  return Split(0.0f,(unsigned)Split::SPLIT_TEMPORAL,0,splitTime);
                }
              }
            }        

            /* otherwise return fallback split */
            return Split(0.0f,Split::SPLIT_FALLBACK);
          }